

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR CorUnix::CPalSynchronizationManager::PrepareForShutdown(void)

{
  ThreadNativeWaitData *__mutex;
  CPalThread *pCVar1;
  IPalObject *pIVar2;
  CPalSynchronizationManager *this;
  uint uVar3;
  PAL_ERROR PVar4;
  int iVar5;
  CPalThread *pthrCurrent;
  int *piVar6;
  pthread_mutex_t *__mutex_00;
  bool bVar7;
  undefined1 auStack_48 [8];
  timespec tsAbsTmo;
  
  this = s_pObjSynchMgr;
  pthrCurrent = (CPalThread *)pthread_getspecific(thObjKey);
  if (pthrCurrent == (CPalThread *)0x0) {
    pthrCurrent = CreateCurrentThreadData();
  }
  auStack_48 = (undefined1  [8])0x0;
  tsAbsTmo.tv_sec = 0;
  LOCK();
  bVar7 = s_lInitStatus == 2;
  uVar3 = s_lInitStatus;
  if (bVar7) {
    s_lInitStatus = 3;
    uVar3 = 2;
  }
  UNLOCK();
  if (bVar7) {
    DiscardMonitoredProcesses(this,pthrCurrent);
    if (this->m_pipoThread == (IPalObject *)0x0) {
      s_lInitStatus = 4;
      return 0;
    }
    PVar4 = WakeUpLocalWorkerThread(this,SynchWorkerCmdShutdown);
    if (PVar4 == 0) {
      pCVar1 = this->m_pthrWorker;
      PVar4 = GetAbsoluteTimeout(2000,(timespec *)auStack_48);
      if (PVar4 == 0) {
        __mutex = &(pCVar1->synchronizationInfo).m_tnwdNativeData;
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar5 == 0) {
          tsAbsTmo.tv_nsec = (__syscall_slong_t)__mutex;
          do {
            if ((pCVar1->synchronizationInfo).m_tnwdNativeData.iPred != 0) {
              (pCVar1->synchronizationInfo).m_tnwdNativeData.iPred = 0;
              __mutex_00 = (pthread_mutex_t *)tsAbsTmo.tv_nsec;
              goto LAB_00344951;
            }
            iVar5 = pthread_cond_timedwait
                              ((pthread_cond_t *)
                               &(pCVar1->synchronizationInfo).m_tnwdNativeData.cond,
                               (pthread_mutex_t *)tsAbsTmo.tv_nsec,(timespec *)auStack_48);
            __mutex_00 = (pthread_mutex_t *)tsAbsTmo.tv_nsec;
          } while (iVar5 == 0);
          if (iVar5 == 0x6e) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_003449a8;
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_003449a8;
            piVar6 = __errno_location();
            strerror(*piVar6);
          }
LAB_00344951:
          iVar5 = pthread_mutex_unlock(__mutex_00);
          if (iVar5 == 0) {
            pIVar2 = this->m_pipoThread;
            if (pIVar2 == (IPalObject *)0x0) {
              s_lInitStatus = 4;
              return 0;
            }
            (*pIVar2->_vptr_IPalObject[8])(pIVar2,pthrCurrent);
            this->m_pipoThread = (IPalObject *)0x0;
            this->m_pthrWorker = (CPalThread *)0x0;
            s_lInitStatus = 4;
            return 0;
          }
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003449a8;
        s_lInitStatus = 5;
        goto LAB_0034487c;
      }
    }
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_003449a8:
      abort();
    }
    s_lInitStatus = 5;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","PrepareForShutdown",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x629);
    fprintf(_stderr,
            "Unexpected initialization status found in PrepareForShutdown [expected=%d current=%d]\n"
            ,2,(ulong)uVar3);
LAB_0034487c:
    PVar4 = 0x54f;
  }
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::PrepareForShutdown()
    {
        PAL_ERROR palErr = NO_ERROR;
        LONG lInit;
        CPalSynchronizationManager * pSynchManager = GetInstance();
        CPalThread * pthrCurrent = InternalGetCurrentThread();
        int iRet;
        ThreadNativeWaitData * ptnwdWorkerThreadNativeData;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        struct timespec tsAbsTmo = { 0, 0 };
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        DWORD dwOldTime = GetTickCount();
        DWORD dwTmo;
        int iPollTmo;
        int iEagains= 0;
        bool fAgain;
        struct pollfd pllfd;
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        lInit = InterlockedCompareExchange(&s_lInitStatus,
            (LONG)SynchMgrStatusShuttingDown, (LONG)SynchMgrStatusRunning);

        if ((LONG)SynchMgrStatusRunning != lInit)
        {
            ASSERT("Unexpected initialization status found "
                   "in PrepareForShutdown [expected=%d current=%d]\n",
                   SynchMgrStatusRunning, lInit);
            // We intentionally not set s_lInitStatus to SynchMgrStatusError
            // cause this could interfere with a previous thread already
            // executing shutdown
            palErr = ERROR_INTERNAL_ERROR;
            goto PFS_exit;
        }

        // Discard process monitoring for process waits
        pSynchManager->DiscardMonitoredProcesses(pthrCurrent);

        if (NULL == pSynchManager->m_pipoThread)
        {
            // If m_pipoThread is NULL here, that means that StartWorker has
            // never been called. That may happen if PAL_Initialize fails
            // sometime after having called CreatePalSynchronizationManager,
            // but before calling StartWorker. Nothing else to do here.
            goto PFS_exit;
        }

        palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdShutdown);
        if (NO_ERROR != palErr)
        {
            ERROR("Failed stopping worker thread [palErr=%u]\n", palErr);
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        ptnwdWorkerThreadNativeData =
            &pSynchManager->m_pthrWorker->synchronizationInfo.m_tnwdNativeData;

#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        palErr = GetAbsoluteTimeout(WorkerThreadTerminationTimeout, &tsAbsTmo);
        if (NO_ERROR != palErr)
        {
            ERROR("Failed to convert timeout to absolute timeout\n");
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        // Using the worker thread's predicate/condition/mutex
        // to wait for worker thread to be done
        iRet = pthread_mutex_lock(&ptnwdWorkerThreadNativeData->mutex);
        if (0 != iRet)
        {
            // pthread calls might fail if the shutdown is called
            // from a signal handler. In this case just don't wait
            // for the worker thread
            ERROR("Cannot lock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        while (FALSE == ptnwdWorkerThreadNativeData->iPred)
        {
            iRet = pthread_cond_timedwait(&ptnwdWorkerThreadNativeData->cond,
                                          &ptnwdWorkerThreadNativeData->mutex,
                                          &tsAbsTmo);
            if (0 != iRet)
            {
                if (ETIMEDOUT == iRet)
                {
                    WARN("Timed out waiting for worker thread to exit "
                         "(tmo=%u ms)\n", WorkerThreadTerminationTimeout);
                }
                else
                {
                    ERROR("pthread_cond_timedwait returned %d [errno=%d (%s)]\n",
                          iRet, errno, strerror(errno));
                }
                break;
            }
        }
        if (0 == iRet)
        {
            ptnwdWorkerThreadNativeData->iPred = FALSE;
        }
        iRet = pthread_mutex_unlock(&ptnwdWorkerThreadNativeData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot unlock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        dwTmo = min(WorkerThreadTerminationTimeout, INT_MAX);

        do
        {
            fAgain = false;

            pllfd.fd = ptnwdWorkerThreadNativeData->iPipeRd;
            pllfd.events = POLLIN;
            pllfd.revents = 0;
            iPollTmo = dwTmo;

            iRet = poll(&pllfd, 1, iPollTmo);

            switch(iRet)
            {
                case 0:
                    // Timeout
                    WARN("Timed out waiting for worker thread to exit "
                         "(tmo=%u ms)\n", WorkerThreadTerminationTimeout);
                    break;
                case 1:
                    // Signal
                    break;
                case -1:
                    if(EINTR == errno)
                    {
                        if (MaxWorkerConsecutiveEintrs >= ++iEagains)
                        {
                            fAgain = true;
                            UpdateTimeout(&dwOldTime, &dwTmo);
                        }
                        else
                        {
                            ERROR("Too many (%d) consecutive EAGAINs while polling "
                                  "pipe %d, waiting for worker thread to exit\n",
                                  iEagains, ptnwdWorkerThreadNativeData->iPipeRd);
                            palErr = ERROR_INTERNAL_ERROR;
                        }
                    }
                    else
                    {
                        ERROR("Unexpected errno=%d (%s) while polling pipe %d\n",
                              errno, strerror(errno),
                              ptnwdWorkerThreadNativeData->iPipeRd);
                        palErr = ERROR_INTERNAL_ERROR;
                    }
                    break;
                default:
                    // Error
                    ERROR("Unexpected return code %d while polling pipe %d\n",
                          iRet, ptnwdWorkerThreadNativeData->iPipeRd);
                    palErr = ERROR_INTERNAL_ERROR;
                    break;
            }
        } while (fAgain);

#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

    PFS_exit:
        if (NO_ERROR == palErr)
        {
            if (NULL != pSynchManager->m_pipoThread)
            {
                pSynchManager->m_pipoThread->ReleaseReference(pthrCurrent);

                // After this release both m_pipoThread and m_pthrWorker
                // are no longer valid
                pSynchManager->m_pipoThread = NULL;
                pSynchManager->m_pthrWorker = NULL;
            }

            // Ready for process shutdown
            s_lInitStatus = SynchMgrStatusReadyForProcessShutDown;
        }

        return palErr;
    }